

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O3

bool striequals(char *a,char *b)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  cVar2 = *a;
  if (cVar2 != '\0') {
    pcVar5 = a + 1;
    do {
      cVar1 = *b;
      if (cVar1 == '\0') goto LAB_00104995;
      iVar3 = tolower((int)cVar2);
      iVar4 = tolower((int)cVar1);
      if (iVar3 != iVar4) {
        return false;
      }
      b = b + 1;
      cVar2 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while (cVar2 != '\0');
  }
  cVar2 = '\0';
LAB_00104995:
  return cVar2 == *b;
}

Assistant:

static bool striequals(const char * a, const char * b) {
    for (; *a && *b; a++, b++) {
        if (std::tolower(*a) != std::tolower(*b)) {
            return false;
        }
    }
    return *a == *b;
}